

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_buffer.h
# Opt level: O3

iterator __thiscall
r_code::time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated>::erase
          (time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *this,iterator *i)

{
  uintptr_t uVar1;
  pointer pcVar2;
  uintptr_t uVar3;
  long lVar4;
  pointer pcVar5;
  int64_t *piVar6;
  iterator iVar7;
  
  uVar1 = i->_cell;
  pcVar2 = (this->super_list<r_exec::CInput>).cells.
           super__Vector_base<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = pcVar2[uVar1].next;
  lVar4 = *(int64_t *)((long)(pcVar2 + uVar1) + 8);
  pcVar5 = pcVar2 + lVar4;
  if (lVar4 == -1) {
    pcVar5 = (pointer)&(this->super_list<r_exec::CInput>).used_cells_head;
  }
  piVar6 = (int64_t *)((long)(pcVar2 + uVar3) + 8);
  if (uVar3 == 0xffffffffffffffff) {
    piVar6 = &(this->super_list<r_exec::CInput>).used_cells_tail;
  }
  pcVar5->next = uVar3;
  *piVar6 = lVar4;
  pcVar2[uVar1].next = (this->super_list<r_exec::CInput>).free_cells;
  (this->super_list<r_exec::CInput>).free_cells = uVar1;
  (this->super_list<r_exec::CInput>).used_cell_count =
       (this->super_list<r_exec::CInput>).used_cell_count - 1;
  (this->super_list<r_exec::CInput>).free_cell_count =
       (this->super_list<r_exec::CInput>).free_cell_count + 1;
  iVar7._cell = uVar3;
  iVar7.buffer = this;
  return iVar7;
}

Assistant:

iterator erase(iterator &i)
    {
        return iterator(this, this->_erase(i._cell));
    }